

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

Result emulator_write_ext_ram_to_file(Emulator *e,char *filename)

{
  Result RVar1;
  undefined1 local_38 [8];
  FileData file_data;
  Result result;
  char *filename_local;
  Emulator *e_local;
  
  if ((e->state).ext_ram.battery_type == BATTERY_TYPE_WITH_BATTERY) {
    file_data.size._4_4_ = ERROR;
    file_data.data = (u8 *)(e->state).ext_ram.size;
    local_38 = (undefined1  [8])malloc((size_t)file_data.data);
    RVar1 = emulator_write_ext_ram(e,(FileData *)local_38);
    if ((RVar1 == OK) && (RVar1 = file_write(filename,(FileData *)local_38), RVar1 == OK)) {
      file_data.size._4_4_ = OK;
    }
    file_data_delete((FileData *)local_38);
    e_local._4_4_ = file_data.size._4_4_;
  }
  else {
    e_local._4_4_ = OK;
  }
  return e_local._4_4_;
}

Assistant:

Result emulator_write_ext_ram_to_file(Emulator* e, const char* filename) {
  if (EXT_RAM.battery_type != BATTERY_TYPE_WITH_BATTERY)
    return OK;

  Result result = ERROR;
  FileData file_data;
  file_data.size = EXT_RAM.size;
  file_data.data = xmalloc(file_data.size);
  CHECK(SUCCESS(emulator_write_ext_ram(e, &file_data)));
  CHECK(SUCCESS(file_write(filename, &file_data)));
  result = OK;
error:
  file_data_delete(&file_data);
  return result;
}